

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O2

VTimeZone * icu_63::VTimeZone::createVTimeZoneByID(UnicodeString *ID)

{
  VTimeZone *this;
  TimeZone *pTVar1;
  UResourceBundle *resB;
  UChar *srcChars;
  size_t in_RSI;
  int32_t len;
  UErrorCode status;
  int32_t local_30;
  UErrorCode local_2c;
  
  this = (VTimeZone *)UMemory::operator_new((UMemory *)0x120,in_RSI);
  if (this != (VTimeZone *)0x0) {
    VTimeZone(this);
  }
  pTVar1 = TimeZone::createTimeZone(ID);
  this->tz = (BasicTimeZone *)pTVar1;
  UnicodeString::operator=(&this->olsonzid,&pTVar1->fID);
  local_2c = U_ZERO_ERROR;
  local_30 = 0;
  resB = ures_openDirect_63((char *)0x0,"zoneinfo64",&local_2c);
  srcChars = ures_getStringByKey_63(resB,"TZVersion",&local_30,&local_2c);
  if (local_2c < U_ILLEGAL_ARGUMENT_ERROR) {
    UnicodeString::setTo(&this->icutzver,srcChars,local_30);
  }
  ures_close_63(resB);
  return this;
}

Assistant:

VTimeZone*
VTimeZone::createVTimeZoneByID(const UnicodeString& ID) {
    VTimeZone *vtz = new VTimeZone();
    vtz->tz = (BasicTimeZone*)TimeZone::createTimeZone(ID);
    vtz->tz->getID(vtz->olsonzid);

    // Set ICU tzdata version
    UErrorCode status = U_ZERO_ERROR;
    UResourceBundle *bundle = NULL;
    const UChar* versionStr = NULL;
    int32_t len = 0;
    bundle = ures_openDirect(NULL, "zoneinfo64", &status);
    versionStr = ures_getStringByKey(bundle, "TZVersion", &len, &status);
    if (U_SUCCESS(status)) {
        vtz->icutzver.setTo(versionStr, len);
    }
    ures_close(bundle);
    return vtz;
}